

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makePop<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *__return_storage_ptr___00;
  Type *pTVar1;
  bool bVar2;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  Result<wasm::Type> _val;
  Result<wasm::Type> type;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20);
  valtype<wasm::WATParser::ParseDefsCtx>((Result<wasm::Type> *)__return_storage_ptr___00,ctx);
  Result<wasm::Type>::Result
            ((Result<wasm::Type> *)local_78,(Result<wasm::Type> *)__return_storage_ptr___00);
  local_90 = Result<wasm::Type>::getErr((Result<wasm::Type> *)local_78);
  bVar2 = local_90 == (Err *)0x0;
  if (!bVar2) {
    wasm::Err::Err(&local_b0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  Result<wasm::Type>::~Result((Result<wasm::Type> *)local_78);
  if (bVar2) {
    pTVar1 = Result<wasm::Type>::operator*
                       ((Result<wasm::Type> *)
                        ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
    ParseDefsCtx::makePop(__return_storage_ptr__,ctx,pos,annotations,(Type)pTVar1->id);
  }
  Result<wasm::Type>::~Result
            ((Result<wasm::Type> *)
             ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<>
makePop(Ctx& ctx, Index pos, const std::vector<Annotation>& annotations) {
  auto type = valtype(ctx);
  CHECK_ERR(type);
  return ctx.makePop(pos, annotations, *type);
}